

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_mkdtemp(void)

{
  uint64_t uVar1;
  ssize_t sVar2;
  int iVar3;
  int extraout_EAX;
  uint uVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  __uid_t _Var5;
  int extraout_EAX_04;
  uv_loop_t *puVar6;
  size_t sVar7;
  char *pcVar8;
  uv_loop_t *puVar9;
  uv_fs_t *puVar10;
  undefined8 uVar11;
  void *pvVar12;
  uv_loop_t *unaff_RBX;
  char *pcVar13;
  uv_fs_t *puVar14;
  uv_fs_t *puVar15;
  undefined8 *puVar16;
  uv_fs_t *puVar17;
  undefined8 *puVar18;
  uv_loop_t *puVar19;
  char *pcVar20;
  uv_fs_t *unaff_R14;
  uv_fs_t *puVar21;
  uv_fs_t *puVar22;
  uv_buf_t uVar23;
  undefined1 auStack_1190 [88];
  long lStack_1138;
  long lStack_1130;
  code *pcStack_fd8;
  code *pcStack_fd0;
  undefined8 uStack_fc8;
  char acStack_fb8 [88];
  char *pcStack_f60;
  uv_loop_t *puStack_e00;
  uv_fs_t *puStack_df8;
  code *pcStack_df0;
  code *pcStack_de8;
  uv_loop_t *puStack_de0;
  code *pcStack_dd8;
  uv_fs_t uStack_dd0;
  uv_fs_t *puStack_c18;
  uv_fs_t *puStack_c10;
  undefined8 uStack_c08;
  uv_fs_t uStack_bf8;
  undefined8 *puStack_a40;
  uv_fs_t *puStack_a38;
  code *pcStack_a30;
  code *pcStack_a28;
  undefined1 auStack_a18 [88];
  long lStack_9c0;
  uint uStack_9a0;
  code *pcStack_860;
  undefined8 uStack_858;
  uv_fs_t uStack_850;
  char *pcStack_698;
  uv_fs_t *puStack_690;
  uv_fs_t uStack_678;
  char *pcStack_4c0;
  uv_fs_t *puStack_4b8;
  code *pcStack_4b0;
  undefined8 uStack_4a8;
  stat64 sStack_498;
  uv_fs_t uStack_408;
  uv_loop_t *puStack_250;
  uv_fs_t *puStack_248;
  uv_loop_t *puStack_238;
  uv_fs_t *puStack_230;
  code *pcStack_228;
  undefined8 uStack_220;
  undefined1 auStack_210 [32];
  void *pvStack_198;
  uv_loop_t *puStack_38;
  code *pcStack_30;
  uv_loop_t *puStack_20;
  
  puVar6 = (uv_loop_t *)uv_default_loop();
  loop = puVar6;
  iVar3 = uv_fs_mkdtemp(puVar6,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  if (iVar3 == 0) {
    puVar6 = loop;
    uv_run(loop,0);
    if (mkdtemp_cb_count != 1) goto LAB_00154259;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdtemp(0,&mkdtemp_req2,"test_dir_XXXXXX",0);
    if (iVar3 != 0) goto LAB_0015425e;
    check_mkdtemp_result(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)mkdtemp_req1.path;
    puVar6 = (uv_loop_t *)mkdtemp_req1.path;
    iVar3 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
    if (iVar3 == 0) goto LAB_00154263;
    rmdir((char *)unaff_RBX);
    rmdir(mkdtemp_req2.path);
    uv_fs_req_cleanup(&mkdtemp_req1);
    uv_fs_req_cleanup(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    puVar6 = (uv_loop_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_mkdtemp_cold_1();
LAB_00154259:
    run_test_fs_mkdtemp_cold_2();
LAB_0015425e:
    run_test_fs_mkdtemp_cold_3();
LAB_00154263:
    run_test_fs_mkdtemp_cold_5();
  }
  run_test_fs_mkdtemp_cold_4();
  if (puVar6 == (uv_loop_t *)&mkdtemp_req1) {
    check_mkdtemp_result(&mkdtemp_req1);
    mkdtemp_cb_count = mkdtemp_cb_count + 1;
    return extraout_EAX;
  }
  mkdtemp_cb_cold_1();
  puStack_20 = unaff_RBX;
  if (puVar6->backend_fd == UV_FS_MKDTEMP) {
    if (puVar6->watcher_queue[0] != (void *)0x0) goto LAB_0015434b;
    unaff_R14 = (uv_fs_t *)puVar6->watchers;
    if (unaff_R14 == (uv_fs_t *)0x0) goto LAB_00154350;
    pcStack_30 = (_func_void *)0x1542c4;
    sVar7 = strlen((char *)unaff_R14);
    if (sVar7 != 0xf) goto LAB_00154355;
    if ((char)unaff_R14->type != 0x5f ||
        (uv__io_t *)unaff_R14->data != (uv__io_t *)0x7269645f74736574) goto LAB_0015435a;
    if (*(short *)&unaff_R14->field_0xd == 0x5858 &&
        *(int *)((long)&unaff_R14->type + 1) == 0x58585858) goto LAB_0015435f;
    pcStack_30 = (_func_void *)0x15430e;
    check_permission((char *)unaff_R14,0x1c0);
    pcStack_30 = (_func_void *)0x154322;
    iVar3 = uv_fs_stat(0,&stat_req,puVar6->watchers,0);
    if (iVar3 != 0) goto LAB_00154364;
    if ((*(byte *)((long)stat_req.ptr + 9) & 0x40) != 0) {
      iVar3 = uv_fs_req_cleanup(&stat_req);
      return iVar3;
    }
  }
  else {
    pcStack_30 = (_func_void *)0x15434b;
    check_mkdtemp_result_cold_1();
    puVar6 = unaff_RBX;
LAB_0015434b:
    pcStack_30 = (_func_void *)0x154350;
    check_mkdtemp_result_cold_2();
LAB_00154350:
    pcStack_30 = (_func_void *)0x154355;
    check_mkdtemp_result_cold_8();
LAB_00154355:
    pcStack_30 = (_func_void *)0x15435a;
    check_mkdtemp_result_cold_3();
LAB_0015435a:
    pcStack_30 = (_func_void *)0x15435f;
    check_mkdtemp_result_cold_4();
LAB_0015435f:
    pcStack_30 = (_func_void *)0x154364;
    check_mkdtemp_result_cold_7();
LAB_00154364:
    pcStack_30 = (_func_void *)0x154369;
    check_mkdtemp_result_cold_5();
  }
  pcStack_30 = run_test_fs_mkstemp;
  check_mkdtemp_result_cold_6();
  puVar9 = (uv_loop_t *)auStack_210;
  auStack_210[0] = 't';
  auStack_210[1] = 'e';
  auStack_210[2] = 's';
  auStack_210[3] = 't';
  auStack_210[4] = '_';
  auStack_210[5] = 'f';
  auStack_210[6] = 'i';
  auStack_210[7] = 'l';
  auStack_210[8] = 'e';
  auStack_210[9] = '_';
  auStack_210[10] = 'X';
  auStack_210[0xb] = 'X';
  auStack_210[0xc] = 'X';
  auStack_210[0xd] = 'X';
  auStack_210[0xe] = 'X';
  auStack_210[0xf] = 'X';
  auStack_210[0x10] = 0;
  pcStack_228 = (code *)0x154390;
  puStack_38 = puVar6;
  pcStack_30 = (code *)unaff_R14;
  pcVar8 = (char *)uv_default_loop();
  pcStack_228 = (code *)0x1543b0;
  loop = (uv_loop_t *)pcVar8;
  iVar3 = uv_fs_mkstemp(pcVar8,&mkstemp_req1,puVar9,mkstemp_cb);
  if (iVar3 == 0) {
    pcStack_228 = (code *)0x1543c6;
    pcVar8 = (char *)loop;
    uv_run(loop,0);
    if (mkstemp_cb_count != 1) goto LAB_00154636;
    pcVar8 = (char *)0x0;
    pcStack_228 = (code *)0x1543e8;
    iVar3 = uv_fs_mkstemp(0,&mkstemp_req2,auStack_210,0);
    if (iVar3 < 0) goto LAB_0015463b;
    pcStack_228 = (code *)0x1543fc;
    check_mkstemp_result(&mkstemp_req2);
    pcStack_228 = (code *)0x15440f;
    pcVar8 = mkstemp_req1.path;
    iVar3 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    if (iVar3 == 0) goto LAB_00154640;
    pcVar8 = (char *)0x0;
    pcStack_228 = (code *)0x15442e;
    iVar3 = uv_fs_mkstemp(0,&mkstemp_req3,"test_file",0);
    if (iVar3 != -0x16) goto LAB_00154645;
    pcStack_228 = (code *)0x154448;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_220 = 0;
    pcVar8 = (char *)0x0;
    pcStack_228 = (code *)0x154484;
    iVar3 = uv_fs_write(0,&stack0xfffffffffffffe10,(undefined4)mkstemp_req1.result,&iov,1,
                        0xffffffffffffffff);
    if (iVar3 != 0xd) goto LAB_0015464a;
    if (pvStack_198 != (void *)0xd) goto LAB_0015464f;
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe10;
    pcStack_228 = (code *)0x1544a9;
    uv_fs_req_cleanup(puVar9);
    pcStack_228 = (code *)0x1544bb;
    uv_fs_close(0,puVar9,(undefined4)mkstemp_req1.result,0);
    pcStack_228 = (code *)0x1544c3;
    uv_fs_req_cleanup(puVar9);
    pcStack_228 = (code *)0x1544d5;
    uv_fs_close(0,puVar9,(undefined4)mkstemp_req2.result,0);
    pcStack_228 = (code *)0x1544dd;
    uv_fs_req_cleanup();
    pcVar8 = (char *)0x0;
    pcStack_228 = (code *)0x1544f6;
    uVar4 = uv_fs_open(0,puVar9,mkstemp_req1.path,0,0,0);
    if ((int)uVar4 < 0) goto LAB_00154654;
    puVar9 = (uv_loop_t *)(ulong)uVar4;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe10;
    pcStack_228 = (code *)0x15450d;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_228 = (code *)0x15452f;
    uVar23 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_220 = 0;
    pcVar8 = (char *)0x0;
    pcStack_228 = (code *)0x154565;
    iov = uVar23;
    iVar3 = uv_fs_read(0,unaff_R14,puVar9,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00154659;
    if ((long)pvStack_198 < 0) goto LAB_0015465e;
    pcVar8 = buf;
    pcStack_228 = (code *)0x15458f;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00154663;
    pcStack_228 = (code *)0x1545a4;
    uv_fs_req_cleanup(&stack0xfffffffffffffe10);
    pcStack_228 = (code *)0x1545b2;
    uv_fs_close(0,&stack0xfffffffffffffe10,uVar4,0);
    pcStack_228 = (code *)0x1545ba;
    uv_fs_req_cleanup(&stack0xfffffffffffffe10);
    pcStack_228 = (code *)0x1545cd;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_228 = (code *)0x1545e0;
    unlink(mkstemp_req2.path);
    pcStack_228 = (code *)0x1545e8;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_228 = (code *)0x1545f0;
    uv_fs_req_cleanup(&mkstemp_req2);
    pcStack_228 = (code *)0x1545f5;
    puVar9 = (uv_loop_t *)uv_default_loop();
    pcStack_228 = (code *)0x154609;
    uv_walk(puVar9,close_walk_cb,0);
    pcStack_228 = (code *)0x154613;
    uv_run(puVar9,0);
    pcStack_228 = (code *)0x154618;
    pcVar8 = (char *)uv_default_loop();
    pcStack_228 = (code *)0x154620;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_228 = (code *)0x154636;
    run_test_fs_mkstemp_cold_1();
LAB_00154636:
    pcStack_228 = (code *)0x15463b;
    run_test_fs_mkstemp_cold_2();
LAB_0015463b:
    pcStack_228 = (code *)0x154640;
    run_test_fs_mkstemp_cold_3();
LAB_00154640:
    pcStack_228 = (code *)0x154645;
    run_test_fs_mkstemp_cold_12();
LAB_00154645:
    pcStack_228 = (code *)0x15464a;
    run_test_fs_mkstemp_cold_4();
LAB_0015464a:
    pcStack_228 = (code *)0x15464f;
    run_test_fs_mkstemp_cold_5();
LAB_0015464f:
    pcStack_228 = (code *)0x154654;
    run_test_fs_mkstemp_cold_6();
LAB_00154654:
    pcStack_228 = (code *)0x154659;
    run_test_fs_mkstemp_cold_7();
LAB_00154659:
    pcStack_228 = (code *)0x15465e;
    run_test_fs_mkstemp_cold_8();
LAB_0015465e:
    pcStack_228 = (code *)0x154663;
    run_test_fs_mkstemp_cold_9();
LAB_00154663:
    pcStack_228 = (code *)0x154668;
    run_test_fs_mkstemp_cold_10();
  }
  pcStack_228 = mkstemp_cb;
  run_test_fs_mkstemp_cold_11();
  if ((uv_fs_t *)pcVar8 == &mkstemp_req1) {
    puStack_230 = (uv_fs_t *)0x154686;
    pcStack_228._0_4_ = extraout_EAX_00;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return (int)pcStack_228;
  }
  puStack_230 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  puStack_238 = puVar9;
  puStack_230 = unaff_R14;
  if (((uv_loop_t *)pcVar8)->backend_fd == UV_FS_MKSTEMP) {
    if ((long)((uv_loop_t *)pcVar8)->watcher_queue[0] < 0) goto LAB_0015474a;
    puVar17 = (uv_fs_t *)((uv_loop_t *)pcVar8)->watchers;
    if (puVar17 == (uv_fs_t *)0x0) goto LAB_0015474f;
    puStack_248 = (uv_fs_t *)0x1546c4;
    sVar7 = strlen((char *)puVar17);
    if (sVar7 != 0x10) goto LAB_00154754;
    if ((short)puVar17->type != 0x5f65 ||
        (uv__io_t *)puVar17->data != (uv__io_t *)0x6c69665f74736574) goto LAB_00154759;
    if (*(short *)&puVar17->field_0xe == 0x5858 && *(int *)((long)&puVar17->type + 2) == 0x58585858)
    goto LAB_0015475e;
    puStack_248 = (uv_fs_t *)0x154711;
    check_permission((char *)puVar17,0x180);
    puStack_248 = (uv_fs_t *)0x154725;
    iVar3 = uv_fs_stat(0,&stat_req,((uv_loop_t *)pcVar8)->watchers,0);
    if (iVar3 != 0) goto LAB_00154763;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      iVar3 = uv_fs_req_cleanup(&stat_req);
      return iVar3;
    }
  }
  else {
    puStack_248 = (uv_fs_t *)0x15474a;
    check_mkstemp_result_cold_1();
    pcVar8 = (char *)puVar9;
LAB_0015474a:
    puStack_248 = (uv_fs_t *)0x15474f;
    check_mkstemp_result_cold_2();
    puVar17 = unaff_R14;
LAB_0015474f:
    puStack_248 = (uv_fs_t *)0x154754;
    check_mkstemp_result_cold_8();
LAB_00154754:
    puStack_248 = (uv_fs_t *)0x154759;
    check_mkstemp_result_cold_3();
LAB_00154759:
    puStack_248 = (uv_fs_t *)0x15475e;
    check_mkstemp_result_cold_4();
LAB_0015475e:
    puStack_248 = (uv_fs_t *)0x154763;
    check_mkstemp_result_cold_7();
LAB_00154763:
    puStack_248 = (uv_fs_t *)0x154768;
    check_mkstemp_result_cold_5();
  }
  puStack_248 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  pcVar13 = "test_file";
  pcStack_4b0 = (code *)0x154786;
  puStack_250 = (uv_loop_t *)pcVar8;
  puStack_248 = puVar17;
  unlink("test_file");
  pcStack_4b0 = (code *)0x15478b;
  loop = (uv_loop_t *)uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  pcStack_4b0 = (code *)0x1547b2;
  iVar3 = uv_fs_open(0,&uStack_408,"test_file",0x42,0x180,0);
  sVar2 = uStack_408.result;
  if (iVar3 < 0) {
    pcStack_4b0 = (code *)0x154b17;
    run_test_fs_fstat_cold_1();
LAB_00154b17:
    pcStack_4b0 = (code *)0x154b1c;
    run_test_fs_fstat_cold_2();
LAB_00154b1c:
    pcStack_4b0 = (code *)0x154b21;
    run_test_fs_fstat_cold_3();
LAB_00154b21:
    pcStack_4b0 = (code *)0x154b26;
    run_test_fs_fstat_cold_4();
LAB_00154b26:
    pcStack_4b0 = (code *)0x154b2b;
    run_test_fs_fstat_cold_5();
LAB_00154b2b:
    pcStack_4b0 = (code *)0x154b30;
    run_test_fs_fstat_cold_6();
LAB_00154b30:
    pcStack_4b0 = (code *)0x154b35;
    run_test_fs_fstat_cold_7();
LAB_00154b35:
    pcStack_4b0 = (code *)0x154b3a;
    run_test_fs_fstat_cold_8();
LAB_00154b3a:
    pcStack_4b0 = (code *)0x154b3f;
    run_test_fs_fstat_cold_9();
LAB_00154b3f:
    pcStack_4b0 = (code *)0x154b44;
    run_test_fs_fstat_cold_10();
LAB_00154b44:
    pcStack_4b0 = (code *)0x154b49;
    run_test_fs_fstat_cold_11();
LAB_00154b49:
    pcStack_4b0 = (code *)0x154b4e;
    run_test_fs_fstat_cold_12();
LAB_00154b4e:
    pcStack_4b0 = (code *)0x154b53;
    run_test_fs_fstat_cold_13();
LAB_00154b53:
    pcStack_4b0 = (code *)0x154b58;
    run_test_fs_fstat_cold_14();
LAB_00154b58:
    pcStack_4b0 = (code *)0x154b5d;
    run_test_fs_fstat_cold_15();
LAB_00154b5d:
    pcStack_4b0 = (code *)0x154b62;
    run_test_fs_fstat_cold_16();
LAB_00154b62:
    pcStack_4b0 = (code *)0x154b67;
    run_test_fs_fstat_cold_17();
LAB_00154b67:
    pcStack_4b0 = (code *)0x154b6c;
    run_test_fs_fstat_cold_18();
LAB_00154b6c:
    pcStack_4b0 = (code *)0x154b71;
    run_test_fs_fstat_cold_19();
LAB_00154b71:
    pcStack_4b0 = (code *)0x154b76;
    run_test_fs_fstat_cold_20();
LAB_00154b76:
    pcStack_4b0 = (code *)0x154b7b;
    run_test_fs_fstat_cold_21();
LAB_00154b7b:
    pcStack_4b0 = (code *)0x154b80;
    run_test_fs_fstat_cold_22();
LAB_00154b80:
    pcStack_4b0 = (code *)0x154b85;
    run_test_fs_fstat_cold_23();
LAB_00154b85:
    pcStack_4b0 = (code *)0x154b8a;
    run_test_fs_fstat_cold_24();
LAB_00154b8a:
    pcStack_4b0 = (code *)0x154b8f;
    run_test_fs_fstat_cold_25();
LAB_00154b8f:
    pcStack_4b0 = (code *)0x154b94;
    run_test_fs_fstat_cold_26();
LAB_00154b94:
    pcStack_4b0 = (code *)0x154b99;
    run_test_fs_fstat_cold_27();
LAB_00154b99:
    pcStack_4b0 = (code *)0x154b9e;
    run_test_fs_fstat_cold_28();
LAB_00154b9e:
    pcStack_4b0 = (code *)0x154ba3;
    run_test_fs_fstat_cold_29();
LAB_00154ba3:
    pcStack_4b0 = (code *)0x154ba8;
    run_test_fs_fstat_cold_30();
LAB_00154ba8:
    pcStack_4b0 = (code *)0x154bad;
    run_test_fs_fstat_cold_31();
LAB_00154bad:
    pcStack_4b0 = (code *)0x154bb2;
    run_test_fs_fstat_cold_32();
LAB_00154bb2:
    pcStack_4b0 = (code *)0x154bb7;
    run_test_fs_fstat_cold_33();
LAB_00154bb7:
    pcStack_4b0 = (code *)0x154bbc;
    run_test_fs_fstat_cold_34();
LAB_00154bbc:
    pcStack_4b0 = (code *)0x154bc1;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar13 = (char *)uStack_408.result;
    if (uStack_408.result < 0) goto LAB_00154b17;
    pcStack_4b0 = (code *)0x1547d8;
    uv_fs_req_cleanup(&uStack_408);
    puVar6 = (uv_loop_t *)(sVar2 & 0xffffffff);
    pcStack_4b0 = (code *)0x1547e4;
    iVar3 = fstat64((int)sVar2,&sStack_498);
    pcVar13 = (char *)sVar2;
    if (iVar3 != 0) goto LAB_00154b1c;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_4b0 = (code *)0x1547ff;
    iVar3 = uv_fs_fstat(0,&uStack_408,sVar2 & 0xffffffff,0);
    if (iVar3 != 0) goto LAB_00154b21;
    if ((char *)uStack_408.result != (char *)0x0) goto LAB_00154b26;
    uVar1 = ((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_gid;
    if ((uVar1 != 0) && (uVar1 != sStack_498.st_ctim.tv_sec)) goto LAB_00154b2b;
    uVar1 = ((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_rdev;
    if ((uVar1 != 0) && (uVar1 != sStack_498.st_ctim.tv_nsec)) goto LAB_00154b30;
    pcStack_4b0 = (code *)0x154860;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_4a8 = 0;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_4b0 = (code *)0x15489b;
    iov = uVar23;
    iVar3 = uv_fs_write(0,&uStack_408,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0xd) goto LAB_00154b35;
    if ((char *)uStack_408.result != (char *)0xd) goto LAB_00154b3a;
    puVar17 = &uStack_408;
    pcStack_4b0 = (code *)0x1548c3;
    uv_fs_req_cleanup(puVar17);
    pcStack_4b0 = (code *)0x1548da;
    memset(&uStack_408.statbuf,0xaa,0xa0);
    puVar6 = (uv_loop_t *)0x0;
    pcStack_4b0 = (code *)0x1548e8;
    iVar3 = uv_fs_fstat(0,puVar17,sVar2 & 0xffffffff,0);
    if (iVar3 != 0) goto LAB_00154b3f;
    if ((char *)uStack_408.result != (char *)0x0) goto LAB_00154b44;
    puVar17 = (uv_fs_t *)uStack_408.ptr;
    if (((void **)((long)uStack_408.ptr + 0x10))[5] != (void *)0xd) goto LAB_00154b49;
    puVar6 = (uv_loop_t *)(sVar2 & 0xffffffff);
    pcStack_4b0 = (code *)0x15491e;
    iVar3 = fstat64((int)sVar2,&sStack_498);
    if (iVar3 != 0) goto LAB_00154b4e;
    if ((uv__io_t *)*(void **)uStack_408.ptr != (uv__io_t *)sStack_498.st_dev) goto LAB_00154b53;
    if (*(ulong *)((long)uStack_408.ptr + 8) != (ulong)sStack_498.st_mode) goto LAB_00154b58;
    if (*(void **)((long)uStack_408.ptr + 0x10) != (void *)sStack_498.st_nlink) goto LAB_00154b5d;
    if (((void **)((long)uStack_408.ptr + 0x10))[1] != (void *)(ulong)sStack_498.st_uid)
    goto LAB_00154b62;
    if (((void **)((long)uStack_408.ptr + 0x10))[2] != (void *)(ulong)sStack_498.st_gid)
    goto LAB_00154b67;
    if (((void **)((long)uStack_408.ptr + 0x10))[3] != (void *)sStack_498.st_rdev)
    goto LAB_00154b6c;
    if (((void **)((long)uStack_408.ptr + 0x10))[4] != (void *)sStack_498.st_ino) goto LAB_00154b71;
    if (((void **)((long)uStack_408.ptr + 0x10))[5] != (void *)sStack_498.st_size)
    goto LAB_00154b76;
    if (*(long *)((long)uStack_408.ptr + 0x40) != sStack_498.st_blksize) goto LAB_00154b7b;
    if (*(uv_loop_t **)((long)uStack_408.ptr + 0x48) != (uv_loop_t *)sStack_498.st_blocks)
    goto LAB_00154b80;
    if (*(void **)((long)uStack_408.ptr + 0x60) != (void *)sStack_498.st_atim.tv_sec)
    goto LAB_00154b85;
    if (*(char **)((long)uStack_408.ptr + 0x68) != (char *)sStack_498.st_atim.tv_nsec)
    goto LAB_00154b8a;
    if (((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_dev != sStack_498.st_mtim.tv_sec)
    goto LAB_00154b8f;
    if (((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_mode != sStack_498.st_mtim.tv_nsec)
    goto LAB_00154b94;
    if (((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_nlink != sStack_498.st_ctim.tv_sec)
    goto LAB_00154b99;
    if (((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_uid != sStack_498.st_ctim.tv_nsec)
    goto LAB_00154b9e;
    if (*(uv_fs_cb *)((long)uStack_408.ptr + 0x50) != (uv_fs_cb)0x0) goto LAB_00154ba3;
    if (*(ssize_t *)((long)uStack_408.ptr + 0x58) != 0) goto LAB_00154ba8;
    puVar17 = &uStack_408;
    pcStack_4b0 = (code *)0x154a41;
    uv_fs_req_cleanup(puVar17);
    pcStack_4b0 = (code *)0x154a59;
    puVar6 = loop;
    iVar3 = uv_fs_fstat(loop,puVar17,sVar2 & 0xffffffff,fstat_cb);
    if (iVar3 != 0) goto LAB_00154bad;
    pcStack_4b0 = (code *)0x154a6f;
    puVar6 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_00154bb2;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_4b0 = (code *)0x154a8f;
    iVar3 = uv_fs_close(0,&uStack_408,sVar2 & 0xffffffff,0);
    if (iVar3 != 0) goto LAB_00154bb7;
    if ((char *)uStack_408.result != (char *)0x0) goto LAB_00154bbc;
    pcStack_4b0 = (code *)0x154ab3;
    uv_fs_req_cleanup(&uStack_408);
    pcStack_4b0 = (code *)0x154ac1;
    uv_run(loop,0);
    pcStack_4b0 = (code *)0x154acd;
    unlink("test_file");
    pcStack_4b0 = (code *)0x154ad2;
    pcVar13 = (char *)uv_default_loop();
    pcStack_4b0 = (code *)0x154ae6;
    uv_walk(pcVar13,close_walk_cb,0);
    pcStack_4b0 = (code *)0x154af0;
    uv_run(pcVar13,0);
    pcStack_4b0 = (code *)0x154af5;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_4b0 = (code *)0x154afd;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_4b0 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar6->backend_fd == 8) {
    if (puVar6->watcher_queue[0] != (void *)0x0) goto LAB_00154bf1;
    if (*(long *)((long)puVar6->watcher_queue[1] + 0x38) == 0xd) {
      puStack_4b8 = (uv_fs_t *)0x154be4;
      pcStack_4b0._0_4_ = extraout_EAX_01;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return (int)pcStack_4b0;
    }
  }
  else {
    puStack_4b8 = (uv_fs_t *)0x154bf1;
    fstat_cb_cold_1();
LAB_00154bf1:
    puStack_4b8 = (uv_fs_t *)0x154bf6;
    fstat_cb_cold_2();
  }
  puStack_4b8 = (uv_fs_t *)run_test_fs_access;
  fstat_cb_cold_3();
  puVar21 = &uStack_678;
  puVar10 = &uStack_678;
  puVar14 = (uv_fs_t *)0x184395;
  pcStack_4c0 = pcVar13;
  puStack_4b8 = puVar17;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  iVar3 = uv_fs_access(0,&uStack_678,"test_file",0,0);
  if (iVar3 < 0) {
    if (-1 < uStack_678.result) goto LAB_00154e64;
    uv_fs_req_cleanup(&uStack_678);
    puVar6 = loop;
    iVar3 = uv_fs_access(loop,&uStack_678,"test_file",0,access_cb);
    puVar14 = &uStack_678;
    if (iVar3 != 0) goto LAB_00154e69;
    puVar6 = loop;
    uv_run(loop,0);
    puVar14 = &uStack_678;
    if (access_cb_count != 1) goto LAB_00154e6e;
    access_cb_count = 0;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_open(0,&uStack_678,"test_file",0x42,0x180,0);
    puVar15 = (uv_fs_t *)uStack_678.result;
    puVar14 = &uStack_678;
    if (iVar3 < 0) goto LAB_00154e73;
    if (uStack_678.result < 0) goto LAB_00154e78;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access(0,&uStack_678,"test_file",0,0);
    puVar17 = &uStack_678;
    if (iVar3 != 0) goto LAB_00154e7d;
    puVar17 = &uStack_678;
    if ((char *)uStack_678.result != (char *)0x0) goto LAB_00154e82;
    uv_fs_req_cleanup(&uStack_678);
    puVar6 = loop;
    iVar3 = uv_fs_access(loop,&uStack_678,"test_file",0,access_cb);
    if (iVar3 != 0) goto LAB_00154e87;
    puVar6 = loop;
    uv_run(loop,0);
    puVar21 = &uStack_678;
    if (access_cb_count != 1) goto LAB_00154e8c;
    access_cb_count = 0;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_close(0,&uStack_678,(ulong)puVar15 & 0xffffffff,0);
    puVar21 = &uStack_678;
    if (iVar3 != 0) goto LAB_00154e91;
    puVar21 = &uStack_678;
    if ((char *)uStack_678.result != (char *)0x0) goto LAB_00154e96;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdir(0,&uStack_678,"test_dir",0x1ff,0);
    puVar15 = &uStack_678;
    puVar21 = &uStack_678;
    if (iVar3 != 0) goto LAB_00154e9b;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access(0,&uStack_678,"test_dir",2,0);
    puVar21 = &uStack_678;
    if (iVar3 != 0) goto LAB_00154ea0;
    puVar10 = &uStack_678;
    puVar21 = &uStack_678;
    if ((char *)uStack_678.result != (char *)0x0) goto LAB_00154ea5;
    uv_fs_req_cleanup(&uStack_678);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    puVar10 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar10,close_walk_cb,0);
    uv_run(puVar10,0);
    puVar6 = (uv_loop_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    puVar21 = &uStack_678;
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00154e64:
    run_test_fs_access_cold_2();
LAB_00154e69:
    run_test_fs_access_cold_3();
LAB_00154e6e:
    run_test_fs_access_cold_4();
LAB_00154e73:
    puVar15 = puVar14;
    run_test_fs_access_cold_5();
LAB_00154e78:
    run_test_fs_access_cold_6();
LAB_00154e7d:
    run_test_fs_access_cold_7();
LAB_00154e82:
    puVar21 = puVar17;
    run_test_fs_access_cold_8();
LAB_00154e87:
    run_test_fs_access_cold_9();
LAB_00154e8c:
    run_test_fs_access_cold_10();
LAB_00154e91:
    run_test_fs_access_cold_11();
LAB_00154e96:
    run_test_fs_access_cold_12();
LAB_00154e9b:
    puVar10 = puVar15;
    run_test_fs_access_cold_13();
LAB_00154ea0:
    run_test_fs_access_cold_14();
LAB_00154ea5:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar6->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    iVar3 = uv_fs_req_cleanup();
    return iVar3;
  }
  access_cb_cold_1();
  pcVar8 = "test_file";
  pcStack_860 = (code *)0x154ee1;
  pcStack_698 = (char *)puVar10;
  puStack_690 = puVar21;
  unlink("test_file");
  pcStack_860 = (code *)0x154ee6;
  loop = (uv_loop_t *)uv_default_loop();
  puVar17 = &uStack_850;
  puVar6 = (uv_loop_t *)0x0;
  pcStack_860 = (code *)0x154f0a;
  iVar3 = uv_fs_open(0,puVar17,"test_file",0x42,0x180,0);
  sVar2 = uStack_850.result;
  if (iVar3 < 0) {
    pcStack_860 = (code *)0x1551dd;
    run_test_fs_chmod_cold_1();
LAB_001551dd:
    pcStack_860 = (code *)0x1551e2;
    run_test_fs_chmod_cold_2();
LAB_001551e2:
    pcStack_860 = (code *)0x1551e7;
    run_test_fs_chmod_cold_3();
LAB_001551e7:
    pcStack_860 = (code *)0x1551ec;
    run_test_fs_chmod_cold_4();
LAB_001551ec:
    pcStack_860 = (code *)0x1551f1;
    run_test_fs_chmod_cold_5();
LAB_001551f1:
    pcStack_860 = (code *)0x1551f6;
    run_test_fs_chmod_cold_6();
LAB_001551f6:
    pcStack_860 = (code *)0x1551fb;
    run_test_fs_chmod_cold_7();
LAB_001551fb:
    pcStack_860 = (code *)0x155200;
    run_test_fs_chmod_cold_8();
LAB_00155200:
    pcStack_860 = (code *)0x155205;
    run_test_fs_chmod_cold_9();
LAB_00155205:
    pcStack_860 = (code *)0x15520a;
    run_test_fs_chmod_cold_10();
LAB_0015520a:
    pcStack_860 = (code *)0x15520f;
    run_test_fs_chmod_cold_11();
LAB_0015520f:
    pcStack_860 = (code *)0x155214;
    run_test_fs_chmod_cold_12();
LAB_00155214:
    pcStack_860 = (code *)0x155219;
    run_test_fs_chmod_cold_13();
LAB_00155219:
    pcStack_860 = (code *)0x15521e;
    run_test_fs_chmod_cold_14();
LAB_0015521e:
    pcStack_860 = (code *)0x155223;
    run_test_fs_chmod_cold_15();
LAB_00155223:
    pcStack_860 = (code *)0x155228;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar8 = (char *)uStack_850.result;
    if (uStack_850.result < 0) goto LAB_001551dd;
    puVar21 = &uStack_850;
    pcStack_860 = (code *)0x154f2d;
    uv_fs_req_cleanup(puVar21);
    pcStack_860 = (code *)0x154f3e;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_858 = 0;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_860 = (code *)0x154f74;
    puVar17 = puVar21;
    iov = uVar23;
    iVar3 = uv_fs_write(0,puVar21,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar8 = (char *)sVar2;
    if (iVar3 != 0xd) goto LAB_001551e2;
    if ((char *)uStack_850.result != (char *)0xd) goto LAB_001551e7;
    puVar21 = &uStack_850;
    pcStack_860 = (code *)0x154f96;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_860 = (code *)0x154faf;
    puVar17 = puVar21;
    iVar3 = uv_fs_chmod(0,puVar21,"test_file",0x80,0);
    if (iVar3 != 0) goto LAB_001551ec;
    if ((char *)uStack_850.result != (char *)0x0) goto LAB_001551f1;
    puVar21 = &uStack_850;
    pcStack_860 = (code *)0x154fd0;
    uv_fs_req_cleanup(puVar21);
    pcStack_860 = (code *)0x154fe4;
    check_permission("test_file",0x80);
    puVar6 = (uv_loop_t *)0x0;
    pcStack_860 = (code *)0x154ff9;
    puVar17 = puVar21;
    iVar3 = uv_fs_chmod(0,puVar21,"test_file",0x100,0);
    if (iVar3 != 0) goto LAB_001551f6;
    if ((char *)uStack_850.result != (char *)0x0) goto LAB_001551fb;
    puVar21 = &uStack_850;
    pcStack_860 = (code *)0x15501a;
    uv_fs_req_cleanup(puVar21);
    pcStack_860 = (code *)0x15502b;
    check_permission("test_file",0x100);
    puVar6 = (uv_loop_t *)0x0;
    pcStack_860 = (code *)0x15503f;
    puVar17 = puVar21;
    iVar3 = uv_fs_fchmod(0,puVar21,sVar2 & 0xffffffff,0x180,0);
    if (iVar3 != 0) goto LAB_00155200;
    if ((char *)uStack_850.result != (char *)0x0) goto LAB_00155205;
    puVar21 = &uStack_850;
    pcStack_860 = (code *)0x155060;
    uv_fs_req_cleanup(puVar21);
    pcStack_860 = (code *)0x155074;
    check_permission("test_file",0x180);
    uStack_850.data = &run_test_fs_chmod::mode;
    pcStack_860 = (code *)0x15509c;
    puVar17 = puVar21;
    puVar6 = loop;
    iVar3 = uv_fs_chmod(loop,puVar21,"test_file",0x80,chmod_cb);
    if (iVar3 != 0) goto LAB_0015520a;
    puVar17 = (uv_fs_t *)0x0;
    pcStack_860 = (code *)0x1550b2;
    puVar6 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015520f;
    chmod_cb_count = 0;
    puVar17 = &uStack_850;
    uStack_850.data = &run_test_fs_chmod::mode_1;
    pcStack_860 = (code *)0x1550f7;
    puVar6 = loop;
    iVar3 = uv_fs_chmod(loop,puVar17,"test_file",0x100,chmod_cb);
    if (iVar3 != 0) goto LAB_00155214;
    puVar17 = (uv_fs_t *)0x0;
    pcStack_860 = (code *)0x15510d;
    puVar6 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155219;
    puVar17 = &uStack_850;
    uStack_850.data = &run_test_fs_chmod::mode_2;
    pcStack_860 = (code *)0x155143;
    puVar6 = loop;
    iVar3 = uv_fs_fchmod(loop,puVar17,sVar2 & 0xffffffff,0x180,fchmod_cb);
    if (iVar3 != 0) goto LAB_0015521e;
    puVar17 = (uv_fs_t *)0x0;
    pcStack_860 = (code *)0x155159;
    puVar6 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_00155223;
    pcStack_860 = (code *)0x15517b;
    uv_fs_close(loop,&uStack_850,sVar2 & 0xffffffff,0);
    pcStack_860 = (code *)0x155189;
    uv_run(loop,0);
    pcStack_860 = (code *)0x155195;
    unlink("test_file");
    pcStack_860 = (code *)0x15519a;
    pcVar8 = (char *)uv_default_loop();
    pcStack_860 = (code *)0x1551ae;
    uv_walk(pcVar8,close_walk_cb,0);
    puVar17 = (uv_fs_t *)0x0;
    pcStack_860 = (code *)0x1551b8;
    uv_run(pcVar8);
    pcStack_860 = (code *)0x1551bd;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_860 = (code *)0x1551c5;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_860 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar16 = (undefined8 *)((ulong)puVar17 & 0xffffffff);
  puVar18 = (undefined8 *)0x0;
  pcStack_a28 = (code *)0x155248;
  pcStack_860 = (code *)pcVar8;
  iVar3 = uv_fs_stat(0,auStack_a18,puVar6,0);
  if (iVar3 == 0) {
    if (lStack_9c0 != 0) goto LAB_0015527c;
    if ((uStack_9a0 & 0x1ff) == (uint)puVar17) {
      pcStack_a28 = (code *)0x15526e;
      iVar3 = uv_fs_req_cleanup(auStack_a18);
      return iVar3;
    }
  }
  else {
    pcStack_a28 = (code *)0x15527c;
    check_permission_cold_1();
LAB_0015527c:
    pcStack_a28 = (code *)0x155281;
    check_permission_cold_2();
  }
  pcStack_a28 = chmod_cb;
  check_permission_cold_3();
  pcStack_a28 = (code *)puVar16;
  if (*(int *)(puVar18 + 8) == 0xd) {
    puVar16 = puVar18;
    if (puVar18[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_a30 = (code *)0x1552a5;
      uv_fs_req_cleanup(puVar18);
      check_permission("test_file",*(uint *)*puVar18);
      return extraout_EAX_02;
    }
  }
  else {
    pcStack_a30 = (code *)0x1552bc;
    chmod_cb_cold_1();
  }
  pcStack_a30 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_a30 = (code *)puVar16;
  if (*(int *)(puVar18 + 8) == 0xe) {
    puStack_a40 = puVar18;
    if (puVar18[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      puStack_a38 = (uv_fs_t *)0x1552e0;
      uv_fs_req_cleanup(puVar18);
      check_permission("test_file",*(uint *)*puVar18);
      return extraout_EAX_03;
    }
  }
  else {
    puStack_a38 = (uv_fs_t *)0x1552f7;
    fchmod_cb_cold_1();
    puStack_a40 = puVar16;
  }
  puStack_a38 = (uv_fs_t *)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar17 = (uv_fs_t *)0x184395;
  puStack_c10 = (uv_fs_t *)0x155315;
  puStack_a38 = puVar21;
  unlink("test_file");
  puStack_c10 = (uv_fs_t *)0x15531a;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_c10 = (uv_fs_t *)0x15533e;
  iVar3 = uv_fs_open(0,&uStack_bf8,"test_file",0x42,0x180,0);
  sVar2 = uStack_bf8.result;
  if (iVar3 < 0) {
    puStack_c10 = (uv_fs_t *)0x1554db;
    run_test_fs_unlink_readonly_cold_1();
LAB_001554db:
    puStack_c10 = (uv_fs_t *)0x1554e0;
    run_test_fs_unlink_readonly_cold_2();
LAB_001554e0:
    puStack_c10 = (uv_fs_t *)0x1554e5;
    run_test_fs_unlink_readonly_cold_3();
LAB_001554e5:
    puStack_c10 = (uv_fs_t *)0x1554ea;
    run_test_fs_unlink_readonly_cold_4();
LAB_001554ea:
    puStack_c10 = (uv_fs_t *)0x1554ef;
    run_test_fs_unlink_readonly_cold_5();
LAB_001554ef:
    puStack_c10 = (uv_fs_t *)0x1554f4;
    run_test_fs_unlink_readonly_cold_6();
LAB_001554f4:
    puStack_c10 = (uv_fs_t *)0x1554f9;
    run_test_fs_unlink_readonly_cold_7();
LAB_001554f9:
    puStack_c10 = (uv_fs_t *)0x1554fe;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar17 = (uv_fs_t *)uStack_bf8.result;
    if (uStack_bf8.result < 0) goto LAB_001554db;
    puVar21 = &uStack_bf8;
    puStack_c10 = (uv_fs_t *)0x155361;
    uv_fs_req_cleanup(puVar21);
    puStack_c10 = (uv_fs_t *)0x155372;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_c08 = 0;
    puStack_c10 = (uv_fs_t *)0x1553a8;
    iov = uVar23;
    iVar3 = uv_fs_write(0,puVar21,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puVar17 = (uv_fs_t *)sVar2;
    if (iVar3 != 0xd) goto LAB_001554e0;
    if ((uv_fs_t *)uStack_bf8.result != (uv_fs_t *)0xd) goto LAB_001554e5;
    puVar21 = &uStack_bf8;
    puStack_c10 = (uv_fs_t *)0x1553ca;
    uv_fs_req_cleanup(puVar21);
    puStack_c10 = (uv_fs_t *)0x1553dd;
    uv_fs_close(loop,puVar21,sVar2 & 0xffffffff,0);
    puStack_c10 = (uv_fs_t *)0x1553f6;
    iVar3 = uv_fs_chmod(0,puVar21,"test_file",0x100,0);
    if (iVar3 != 0) goto LAB_001554ea;
    if ((uv_fs_t *)uStack_bf8.result != (uv_fs_t *)0x0) goto LAB_001554ef;
    puVar17 = &uStack_bf8;
    puStack_c10 = (uv_fs_t *)0x155417;
    uv_fs_req_cleanup(puVar17);
    puVar21 = (uv_fs_t *)0x184395;
    puStack_c10 = (uv_fs_t *)0x15542b;
    check_permission("test_file",0x100);
    puStack_c10 = (uv_fs_t *)0x15543a;
    iVar3 = uv_fs_unlink(0,puVar17,"test_file",0);
    if (iVar3 != 0) goto LAB_001554f4;
    if ((uv_fs_t *)uStack_bf8.result != (uv_fs_t *)0x0) goto LAB_001554f9;
    puStack_c10 = (uv_fs_t *)0x15545b;
    uv_fs_req_cleanup(&uStack_bf8);
    puStack_c10 = (uv_fs_t *)0x155469;
    uv_run(loop,0);
    puVar21 = (uv_fs_t *)0x184395;
    puStack_c10 = (uv_fs_t *)0x155485;
    uv_fs_chmod(0,&uStack_bf8,"test_file",0x180,0);
    puStack_c10 = (uv_fs_t *)0x15548d;
    uv_fs_req_cleanup(&uStack_bf8);
    puStack_c10 = (uv_fs_t *)0x155495;
    unlink("test_file");
    puStack_c10 = (uv_fs_t *)0x15549a;
    puVar17 = (uv_fs_t *)uv_default_loop();
    puStack_c10 = (uv_fs_t *)0x1554ae;
    uv_walk(puVar17,close_walk_cb,0);
    puStack_c10 = (uv_fs_t *)0x1554b8;
    uv_run(puVar17,0);
    puStack_c10 = (uv_fs_t *)0x1554bd;
    uVar11 = uv_default_loop();
    puStack_c10 = (uv_fs_t *)0x1554c5;
    iVar3 = uv_loop_close(uVar11);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_c10 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar22 = &uStack_dd0;
  puVar15 = &uStack_dd0;
  puVar14 = &uStack_dd0;
  puVar10 = &uStack_dd0;
  puVar6 = (uv_loop_t *)0x184395;
  pcStack_dd8 = (code *)0x15551c;
  puStack_c18 = puVar17;
  puStack_c10 = puVar21;
  unlink("test_file");
  pcStack_dd8 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_dd8 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar9 = (uv_loop_t *)0x0;
  pcStack_dd8 = (code *)0x15554f;
  iVar3 = uv_fs_open(0,&uStack_dd0,"test_file",0x42,0x180,0);
  sVar2 = uStack_dd0.result;
  if (iVar3 < 0) {
    pcStack_dd8 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_dd8 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_dd8 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    puVar22 = puVar21;
    pcStack_dd8 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_dd8 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    puVar15 = puVar22;
    pcStack_dd8 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_dd8 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_dd8 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_dd8 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_dd8 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_dd8 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_dd8 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_dd8 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    puVar14 = puVar15;
    pcStack_dd8 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_dd8 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    puVar10 = puVar14;
    pcStack_dd8 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_dd8 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_dd8 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_dd8 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_dd8 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar6 = (uv_loop_t *)uStack_dd0.result;
    if (uStack_dd0.result < 0) goto LAB_00155820;
    pcStack_dd8 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar9 = (uv_loop_t *)0x0;
    pcStack_dd8 = (code *)0x15558f;
    iVar3 = uv_fs_chown(0,&uStack_dd0,"test_file",0xffffffff,0xffffffff,0);
    puVar6 = (uv_loop_t *)sVar2;
    puVar21 = &uStack_dd0;
    if (iVar3 != 0) goto LAB_00155825;
    puVar21 = &uStack_dd0;
    if ((uv_loop_t *)uStack_dd0.result != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_dd8 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar9 = (uv_loop_t *)0x0;
    pcStack_dd8 = (code *)0x1555c8;
    iVar3 = uv_fs_fchown(0,&uStack_dd0,sVar2 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar3 != 0) goto LAB_0015582f;
    puVar22 = &uStack_dd0;
    if ((uv_loop_t *)uStack_dd0.result != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_dd8 = (code *)0x1555e7;
    uv_fs_req_cleanup(&uStack_dd0);
    pcStack_dd8 = (code *)0x15560f;
    puVar9 = loop;
    iVar3 = uv_fs_chown(loop,&uStack_dd0,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar3 != 0) goto LAB_00155839;
    pcStack_dd8 = (code *)0x155625;
    puVar9 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_dd0;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_dd8 = (code *)0x15565e;
    puVar9 = loop;
    iVar3 = uv_fs_chown(loop,&uStack_dd0,"test_file",0,0,chown_root_cb);
    puVar15 = &uStack_dd0;
    if (iVar3 != 0) goto LAB_00155843;
    pcStack_dd8 = (code *)0x155674;
    puVar9 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_dd0;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_dd8 = (code *)0x1556a4;
    puVar9 = loop;
    iVar3 = uv_fs_fchown(loop,&uStack_dd0,sVar2 & 0xffffffff,0xffffffff,0xffffffff,fchown_cb);
    puVar15 = &uStack_dd0;
    if (iVar3 != 0) goto LAB_0015584d;
    pcStack_dd8 = (code *)0x1556ba;
    puVar9 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_dd0;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar9 = (uv_loop_t *)0x0;
    pcStack_dd8 = (code *)0x1556e2;
    iVar3 = uv_fs_link(0,&uStack_dd0,"test_file","test_file_link",0);
    puVar15 = &uStack_dd0;
    if (iVar3 != 0) goto LAB_00155857;
    puVar15 = &uStack_dd0;
    if ((uv_loop_t *)uStack_dd0.result != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_dd8 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar9 = (uv_loop_t *)0x0;
    pcStack_dd8 = (code *)0x155720;
    iVar3 = uv_fs_lchown(0,&uStack_dd0,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar3 != 0) goto LAB_00155861;
    puVar14 = &uStack_dd0;
    if ((uv_loop_t *)uStack_dd0.result != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_dd8 = (code *)0x15573f;
    uv_fs_req_cleanup(&uStack_dd0);
    pcStack_dd8 = (code *)0x155767;
    puVar9 = loop;
    iVar3 = uv_fs_lchown(loop,&uStack_dd0,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_0015586b;
    pcStack_dd8 = (code *)0x15577d;
    puVar9 = loop;
    uv_run(loop,0);
    puVar10 = &uStack_dd0;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar9 = (uv_loop_t *)0x0;
    pcStack_dd8 = (code *)0x155798;
    iVar3 = uv_fs_close(0,&uStack_dd0,sVar2 & 0xffffffff,0);
    puVar10 = &uStack_dd0;
    if (iVar3 != 0) goto LAB_00155875;
    puVar10 = &uStack_dd0;
    if ((uv_loop_t *)uStack_dd0.result != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_dd8 = (code *)0x1557b4;
    uv_fs_req_cleanup(&uStack_dd0);
    pcStack_dd8 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_dd8 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_dd8 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_dd8 = (code *)0x1557df;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_dd8 = (code *)0x1557f3;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_dd8 = (code *)0x1557fd;
    uv_run(puVar6,0);
    pcStack_dd8 = (code *)0x155802;
    puVar9 = (uv_loop_t *)uv_default_loop();
    pcStack_dd8 = (code *)0x15580a;
    iVar3 = uv_loop_close();
    puVar10 = &uStack_dd0;
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_dd8 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar9->backend_fd == 0x1a) {
    if (puVar9->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    puStack_de0 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_de0 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_de0 = puVar6;
  if (puVar9->backend_fd == 0x1a) {
    pcStack_de8 = (code *)0x1558b7;
    puVar19 = puVar9;
    _Var5 = geteuid();
    pvVar12 = puVar9->watcher_queue[0];
    if (_Var5 != 0) {
      if (pvVar12 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_de8 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar6 = puVar9;
    if (pvVar12 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup(puVar9);
      return iVar3;
    }
  }
  else {
    pcStack_de8 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar19 = puVar9;
  }
  pcStack_de8 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar19->backend_fd == 0x1b) {
    if (puVar19->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    pcStack_df0 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_df0 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar19->backend_fd == 0x1e) {
    if (puVar19->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    puStack_df8 = (uv_fs_t *)0x15592b;
    lchown_cb_cold_1();
  }
  puStack_df8 = (uv_fs_t *)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar13 = "test_file";
  pcStack_fd0 = (code *)0x155949;
  puStack_e00 = puVar6;
  puStack_df8 = puVar10;
  unlink("test_file");
  pcStack_fd0 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_fd0 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_fd0 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar20 = (char *)0x0;
  pcStack_fd0 = (code *)0x15598a;
  iVar3 = uv_fs_open(0,acStack_fb8,"test_file",0x42,0x180,0);
  pcVar8 = pcStack_f60;
  if (iVar3 < 0) {
    pcStack_fd0 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_fd0 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_fd0 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_fd0 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_fd0 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_fd0 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar8 = pcVar13;
    pcStack_fd0 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_fd0 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_fd0 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_fd0 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_fd0 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_fd0 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_fd0 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar13 = pcVar8;
    pcStack_fd0 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_fd0 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_fd0 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_fd0 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_fd0 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar13 = pcStack_f60;
    if ((long)pcStack_f60 < 0) goto LAB_00155cc8;
    pcStack_fd0 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_fb8);
    pcStack_fd0 = (code *)0x1559be;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_fc8 = 0;
    pcVar20 = (char *)0x0;
    pcStack_fd0 = (code *)0x1559f4;
    iov = uVar23;
    iVar3 = uv_fs_write(0,acStack_fb8,(ulong)pcVar8 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar13 = pcVar8;
    if (iVar3 != 0xd) goto LAB_00155ccd;
    if (pcStack_f60 != (char *)0xd) goto LAB_00155cd2;
    pcStack_fd0 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_fb8);
    pcStack_fd0 = (code *)0x155a29;
    uv_fs_close(loop,acStack_fb8,(ulong)pcVar8 & 0xffffffff,0);
    pcVar20 = (char *)0x0;
    pcStack_fd0 = (code *)0x155a44;
    iVar3 = uv_fs_link(0,acStack_fb8,"test_file","test_file_link",0);
    if (iVar3 != 0) goto LAB_00155cd7;
    if (pcStack_f60 != (char *)0x0) goto LAB_00155cdc;
    pcStack_fd0 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar20 = (char *)0x0;
    pcStack_fd0 = (code *)0x155a81;
    iVar3 = uv_fs_open(0,acStack_fb8,"test_file_link",2,0,0);
    pcVar8 = pcStack_f60;
    pcVar13 = acStack_fb8;
    if (iVar3 < 0) goto LAB_00155ce1;
    if ((long)pcStack_f60 < 0) goto LAB_00155ce6;
    pcStack_fd0 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_fb8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_fd0 = (code *)0x155ac6;
    uVar23 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_fc8 = 0;
    pcVar20 = (char *)0x0;
    pcStack_fd0 = (code *)0x155af8;
    iov = uVar23;
    iVar3 = uv_fs_read(0,acStack_fb8,(ulong)pcVar8 & 0xffffffff,&iov,1,0);
    if (iVar3 < 0) goto LAB_00155ceb;
    if ((long)pcStack_f60 < 0) goto LAB_00155cf0;
    pcVar20 = buf;
    pcStack_fd0 = (code *)0x155b1f;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00155cf5;
    pcStack_fd0 = (code *)0x155b2e;
    close((int)pcVar8);
    pcStack_fd0 = (code *)0x155b54;
    pcVar20 = (char *)loop;
    iVar3 = uv_fs_link(loop,acStack_fb8,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_00155cfa;
    pcStack_fd0 = (code *)0x155b6a;
    pcVar20 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar20 = (char *)0x0;
    pcStack_fd0 = (code *)0x155b95;
    iVar3 = uv_fs_open(0,acStack_fb8,"test_file_link2",2,0,0);
    pcVar13 = pcStack_f60;
    if (iVar3 < 0) goto LAB_00155d04;
    if ((long)pcStack_f60 < 0) goto LAB_00155d09;
    pcStack_fd0 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_fb8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_fd0 = (code *)0x155bda;
    uVar23 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_fc8 = 0;
    pcVar20 = (char *)0x0;
    pcStack_fd0 = (code *)0x155c0c;
    iov = uVar23;
    iVar3 = uv_fs_read(0,acStack_fb8,(ulong)pcVar13 & 0xffffffff,&iov,1,0);
    if (iVar3 < 0) goto LAB_00155d0e;
    if ((long)pcStack_f60 < 0) goto LAB_00155d13;
    pcVar20 = buf;
    pcStack_fd0 = (code *)0x155c33;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00155d18;
    pcStack_fd0 = (code *)0x155c50;
    uv_fs_close(loop,acStack_fb8,(ulong)pcVar13 & 0xffffffff,0);
    pcStack_fd0 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_fd0 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_fd0 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_fd0 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_fd0 = (code *)0x155c87;
    pcVar13 = (char *)uv_default_loop();
    pcStack_fd0 = (code *)0x155c9b;
    uv_walk(pcVar13,close_walk_cb,0);
    pcStack_fd0 = (code *)0x155ca5;
    uv_run(pcVar13,0);
    pcStack_fd0 = (code *)0x155caa;
    pcVar20 = (char *)uv_default_loop();
    pcStack_fd0 = (code *)0x155cb2;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_fd0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar20)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar20)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    pcStack_fd8 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_fd8 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_fd8 = (code *)pcVar13;
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = uv_fs_readlink(loop,auStack_1190,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(loop,0);
    if (iVar3 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_1130 != 0) goto LAB_00155e45;
    if (lStack_1138 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_1190);
    iVar3 = uv_fs_readlink(0,auStack_1190,"no_such_file",0);
    if (iVar3 != -2) goto LAB_00155e4f;
    if (lStack_1130 != 0) goto LAB_00155e54;
    if (lStack_1138 == -2) {
      uv_fs_req_cleanup(auStack_1190);
      uVar11 = uv_default_loop();
      uv_walk(uVar11,close_walk_cb,0);
      uv_run(uVar11,0);
      uVar11 = uv_default_loop();
      iVar3 = uv_loop_close(uVar11);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_04;
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdtemp_cb_count == 1);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT(r == 0);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT(strcmp(mkdtemp_req1.path, mkdtemp_req2.path) != 0);

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}